

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingSolver
          (MultipleShootingSolver *this,
          shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> *ocProblem)

{
  MultipleShootingTranscription *pMVar1;
  shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> local_40;
  shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem> local_30;
  
  local_30.
  super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ocProblem->
           super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_30.
  super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (ocProblem->
       super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_30.
      super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.
       super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.
       super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  OptimalControlSolver::OptimalControlSolver(&this->super_OptimalControlSolver,&local_30);
  if (local_30.
      super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->super_OptimalControlSolver)._vptr_OptimalControlSolver =
       (_func_int **)&PTR__MultipleShootingSolver_0019ac30;
  (this->m_transcription).
  super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_transcription).
  super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_optimizer).
  super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_optimizer).
  super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pMVar1 = (MultipleShootingTranscription *)operator_new(0xa80);
  MultipleShootingTranscription::MultipleShootingTranscription(pMVar1);
  std::
  __shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription>
            (&(this->m_transcription).
              super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
             ,pMVar1);
  pMVar1 = (this->m_transcription).
           super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_40.
  super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ocProblem->
           super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_40.
  super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (ocProblem->
       super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_40.
      super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.
       super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.
       super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  MultipleShootingTranscription::setOptimalControlProblem(pMVar1,&local_40);
  if (local_40.
      super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

MultipleShootingSolver::MultipleShootingSolver(const std::shared_ptr<OptimalControlProblem> &ocProblem)
        : OptimalControlSolver(ocProblem)
        {
            m_transcription.reset(new MultipleShootingTranscription());
            assert(m_transcription);
            m_transcription->setOptimalControlProblem(ocProblem);
        }